

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_keyx.c
# Opt level: O1

int VKO_compute_key(uchar *shared_key,EC_POINT *pub_key,EC_KEY *priv_key,uchar *ukm,size_t ukm_size,
                   int vko_dgst_nid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  BN_CTX *ctx;
  char *name;
  EVP_MD *type;
  EC_GROUP *group;
  BIGNUM *pBVar4;
  BIGNUM *pBVar5;
  BIGNUM *pBVar6;
  EC_POINT *r;
  long lVar7;
  BIGNUM *b;
  BIGNUM *m;
  void *d;
  EVP_MD_CTX *ctx_00;
  
  ctx = (BN_CTX *)BN_CTX_secure_new();
  if (ctx == (BN_CTX *)0x0) {
    ERR_GOST_error(0x89,0xc0100,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                   ,0x2b);
    return 0;
  }
  BN_CTX_start(ctx);
  name = OBJ_nid2sn(vko_dgst_nid);
  type = EVP_get_digestbyname(name);
  if (type == (EVP_MD *)0x0) {
    ERR_GOST_error(0x89,0x70,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                   ,0x32);
LAB_001225d6:
    r = (EC_POINT *)0x0;
LAB_001225d9:
    ctx_00 = (EVP_MD_CTX *)0x0;
    d = (void *)0x0;
  }
  else {
    group = EC_KEY_get0_group((EC_KEY *)priv_key);
    pBVar4 = BN_CTX_get(ctx);
    pBVar5 = BN_CTX_get(ctx);
    pBVar6 = BN_CTX_get(ctx);
    if ((pBVar6 == (BIGNUM *)0x0) || (r = EC_POINT_new(group), r == (EC_POINT *)0x0))
    goto LAB_001225d6;
    lVar7 = BN_lebin2bn(ukm,ukm_size & 0xffffffff,pBVar4);
    if (lVar7 == 0) {
LAB_00122684:
      d = (void *)0x0;
      goto LAB_0012268c;
    }
    b = EC_KEY_get0_private_key((EC_KEY *)priv_key);
    m = (BIGNUM *)EC_GROUP_get0_order(group);
    iVar1 = BN_mod_mul(pBVar4,pBVar4,b,m,ctx);
    if (iVar1 == 0) goto LAB_001225d9;
    iVar2 = 0;
    iVar1 = gost_ec_point_mul((EC_GROUP *)group,(EC_POINT *)r,(BIGNUM *)0x0,pub_key,(BIGNUM *)pBVar4
                              ,(BN_CTX *)ctx);
    if (iVar1 == 0) {
      ERR_GOST_error(0x89,0x6b,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                     ,0x51);
      ctx_00 = (EVP_MD_CTX *)0x0;
      d = (void *)0x0;
      goto LAB_001225e1;
    }
    iVar1 = EC_POINT_get_affine_coordinates(group,r,pBVar5,pBVar6,ctx);
    if (iVar1 == 0) {
      ERR_GOST_error(0x89,0x80010,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                     ,0x55);
      goto LAB_001225d9;
    }
    pBVar4 = (BIGNUM *)EC_GROUP_get0_field(group);
    iVar2 = BN_num_bits(pBVar4);
    iVar1 = iVar2 + 0xe;
    if (-1 < iVar2 + 7) {
      iVar1 = iVar2 + 7;
    }
    iVar1 = iVar1 >> 3;
    d = CRYPTO_malloc(iVar1 * 2,
                      "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                      ,0x5b);
    if (d == (void *)0x0) {
      ERR_GOST_error(0x89,0xc0100,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                     ,0x5c);
      goto LAB_00122684;
    }
    iVar2 = BN_bn2lebinpad(pBVar5,d,iVar1);
    if (iVar2 != iVar1) {
LAB_0012268c:
      ctx_00 = (EVP_MD_CTX *)0x0;
      iVar2 = 0;
      goto LAB_001225e1;
    }
    iVar3 = BN_bn2lebinpad(pBVar6,(long)d + (long)iVar1,iVar1);
    iVar2 = 0;
    if (iVar3 != iVar1) goto LAB_0012268c;
    ctx_00 = (EVP_MD_CTX *)EVP_MD_CTX_new();
    if (ctx_00 == (EVP_MD_CTX *)0x0) {
      ERR_GOST_error(0x89,0xc0100,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                     ,0x68);
      ctx_00 = (EVP_MD_CTX *)0x0;
    }
    else {
      iVar3 = EVP_MD_CTX_reset(ctx_00);
      if ((((iVar3 == 0) || (iVar3 = EVP_DigestInit_ex(ctx_00,type,(ENGINE *)0x0), iVar3 == 0)) ||
          (iVar1 = EVP_DigestUpdate(ctx_00,d,(long)(iVar1 * 2)), iVar1 == 0)) ||
         (iVar1 = EVP_DigestFinal_ex(ctx_00,shared_key,(uint *)0x0), iVar1 == 0)) {
        ERR_GOST_error(0x89,0x80006,
                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                       ,0x70);
        goto LAB_001225e1;
      }
      iVar1 = EVP_MD_get_size(type);
      if (0 < iVar1) {
        iVar2 = EVP_MD_get_size(type);
        goto LAB_001225e1;
      }
    }
  }
  iVar2 = 0;
LAB_001225e1:
  BN_CTX_end(ctx);
  BN_CTX_free(ctx);
  EC_POINT_free(r);
  EVP_MD_CTX_free(ctx_00);
  CRYPTO_free(d);
  return iVar2;
}

Assistant:

int VKO_compute_key(unsigned char *shared_key,
                    const EC_POINT *pub_key, const EC_KEY *priv_key,
                    const unsigned char *ukm, const size_t ukm_size,
                    const int vko_dgst_nid)
{
    unsigned char *databuf = NULL;
    BIGNUM *scalar = NULL, *X = NULL, *Y = NULL;
    const EC_GROUP *grp = NULL;
    EC_POINT *pnt = NULL;
    BN_CTX *ctx = NULL;
    EVP_MD_CTX *mdctx = NULL;
    const EVP_MD *md = NULL;
    int buf_len, half_len;
    int ret = 0;

    if ((ctx = BN_CTX_secure_new()) == NULL) {
        GOSTerr(GOST_F_VKO_COMPUTE_KEY, ERR_R_MALLOC_FAILURE);
        return 0;
    }
    BN_CTX_start(ctx);

    md = EVP_get_digestbynid(vko_dgst_nid);
    if (!md) {
        GOSTerr(GOST_F_VKO_COMPUTE_KEY, GOST_R_INVALID_DIGEST_TYPE);
        goto err;
    }

    grp = EC_KEY_get0_group(priv_key);
    scalar = BN_CTX_get(ctx);
    X = BN_CTX_get(ctx);

    if ((Y = BN_CTX_get(ctx)) == NULL
        || (pnt = EC_POINT_new(grp)) == NULL
        || BN_lebin2bn(ukm, ukm_size, scalar) == NULL
        || !BN_mod_mul(scalar, scalar, EC_KEY_get0_private_key(priv_key),
                       EC_GROUP_get0_order(grp), ctx))
        goto err;

#if 0
    /*-
     * These two curves have cofactor 4; the rest have cofactor 1.
     * But currently gost_ec_point_mul takes care of the cofactor clearing,
     * hence this code is not needed.
     */
    switch (EC_GROUP_get_curve_name(grp)) {
        case NID_id_tc26_gost_3410_2012_256_paramSetA:
        case NID_id_tc26_gost_3410_2012_512_paramSetC:
            if (!BN_lshift(scalar, scalar, 2))
                goto err;
            break;
    }
#endif

    if (!gost_ec_point_mul(grp, pnt, NULL, pub_key, scalar, ctx)) {
        GOSTerr(GOST_F_VKO_COMPUTE_KEY, GOST_R_ERROR_POINT_MUL);
        goto err;
    }
    if (!EC_POINT_get_affine_coordinates(grp, pnt, X, Y, ctx)) {
        GOSTerr(GOST_F_VKO_COMPUTE_KEY, ERR_R_EC_LIB);
        goto err;
    }

    half_len = BN_num_bytes(EC_GROUP_get0_field(grp));
    buf_len = 2 * half_len;
    if ((databuf = OPENSSL_malloc(buf_len)) == NULL) {
        GOSTerr(GOST_F_VKO_COMPUTE_KEY, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    /*
     * Serialize elliptic curve point same way as we do it when saving key
     */
    if (BN_bn2lebinpad(X, databuf, half_len) != half_len
        || BN_bn2lebinpad(Y, databuf + half_len, half_len) != half_len)
        goto err;

    if ((mdctx = EVP_MD_CTX_new()) == NULL) {
        GOSTerr(GOST_F_VKO_COMPUTE_KEY, ERR_R_MALLOC_FAILURE);
        goto err;
    }

    if (EVP_MD_CTX_init(mdctx) == 0
        || EVP_DigestInit_ex(mdctx, md, NULL) == 0
        || EVP_DigestUpdate(mdctx, databuf, buf_len) == 0
        || EVP_DigestFinal_ex(mdctx, shared_key, NULL) == 0) {
        GOSTerr(GOST_F_VKO_COMPUTE_KEY, ERR_R_EVP_LIB);
        goto err;
    }

    ret = (EVP_MD_size(md) > 0) ? EVP_MD_size(md) : 0;

 err:
    BN_CTX_end(ctx);
    BN_CTX_free(ctx);
    EC_POINT_free(pnt);
    EVP_MD_CTX_free(mdctx);
    OPENSSL_free(databuf);

    return ret;
}